

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collision_Elastic_PDU.cpp
# Opt level: O0

KBOOL __thiscall
KDIS::PDU::Collision_Elastic_PDU::operator==
          (Collision_Elastic_PDU *this,Collision_Elastic_PDU *Value)

{
  KBOOL KVar1;
  Collision_Elastic_PDU *Value_local;
  Collision_Elastic_PDU *this_local;
  
  KVar1 = Header7::operator!=(&this->super_Header,&Value->super_Header);
  if (KVar1) {
    this_local._7_1_ = false;
  }
  else {
    KVar1 = DATA_TYPE::EntityIdentifier::operator!=
                      (&this->m_IssuingEntityID,&Value->m_IssuingEntityID);
    if (KVar1) {
      this_local._7_1_ = false;
    }
    else {
      KVar1 = DATA_TYPE::EntityIdentifier::operator!=
                        (&this->m_CollidingEntityID,&Value->m_CollidingEntityID);
      if (KVar1) {
        this_local._7_1_ = false;
      }
      else {
        KVar1 = DATA_TYPE::EntityIdentifier::operator!=(&this->m_EventID,&Value->m_EventID);
        if (KVar1) {
          this_local._7_1_ = false;
        }
        else {
          KVar1 = DATA_TYPE::Vector::operator!=(&this->m_ContactVelocity,&Value->m_ContactVelocity);
          if (KVar1) {
            this_local._7_1_ = false;
          }
          else if (((float)this->m_f32Mass != (float)Value->m_f32Mass) ||
                  (NAN((float)this->m_f32Mass) || NAN((float)Value->m_f32Mass))) {
            this_local._7_1_ = false;
          }
          else {
            KVar1 = DATA_TYPE::Vector::operator!=(&this->m_Location,&Value->m_Location);
            if (KVar1) {
              this_local._7_1_ = false;
            }
            else if (((float)this->m_f32CIRXX != (float)Value->m_f32CIRXX) ||
                    (NAN((float)this->m_f32CIRXX) || NAN((float)Value->m_f32CIRXX))) {
              this_local._7_1_ = false;
            }
            else if (((float)this->m_f32CIRXY != (float)Value->m_f32CIRXY) ||
                    (NAN((float)this->m_f32CIRXY) || NAN((float)Value->m_f32CIRXY))) {
              this_local._7_1_ = false;
            }
            else if (((float)this->m_f32CIRXZ != (float)Value->m_f32CIRXZ) ||
                    (NAN((float)this->m_f32CIRXZ) || NAN((float)Value->m_f32CIRXZ))) {
              this_local._7_1_ = false;
            }
            else if (((float)this->m_f32CIRYY != (float)Value->m_f32CIRYY) ||
                    (NAN((float)this->m_f32CIRYY) || NAN((float)Value->m_f32CIRYY))) {
              this_local._7_1_ = false;
            }
            else if (((float)this->m_f32CIRYZ != (float)Value->m_f32CIRYZ) ||
                    (NAN((float)this->m_f32CIRYZ) || NAN((float)Value->m_f32CIRYZ))) {
              this_local._7_1_ = false;
            }
            else if (((float)this->m_f32CIRZZ != (float)Value->m_f32CIRZZ) ||
                    (NAN((float)this->m_f32CIRZZ) || NAN((float)Value->m_f32CIRZZ))) {
              this_local._7_1_ = false;
            }
            else {
              KVar1 = DATA_TYPE::Vector::operator!=
                                (&this->m_UnitSurfaceNormal,&Value->m_UnitSurfaceNormal);
              if (KVar1) {
                this_local._7_1_ = false;
              }
              else if (((float)this->m_f32COR != (float)Value->m_f32COR) ||
                      (NAN((float)this->m_f32COR) || NAN((float)Value->m_f32COR))) {
                this_local._7_1_ = false;
              }
              else {
                this_local._7_1_ = true;
              }
            }
          }
        }
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

KBOOL Collision_Elastic_PDU::operator == ( const Collision_Elastic_PDU & Value ) const
{
    if( Header::operator     !=( Value ) )                   return false;
    if( m_IssuingEntityID    != Value.m_IssuingEntityID )    return false;
    if( m_CollidingEntityID  != Value.m_CollidingEntityID )  return false;
    if( m_EventID            != Value.m_EventID )            return false;
    if( m_ContactVelocity    != Value.m_ContactVelocity )    return false;
    if( m_f32Mass            != Value.m_f32Mass )            return false;
    if( m_Location           != Value.m_Location )           return false;
    if( m_f32CIRXX           != Value.m_f32CIRXX )           return false;
    if( m_f32CIRXY           != Value.m_f32CIRXY )           return false;
    if( m_f32CIRXZ           != Value.m_f32CIRXZ )           return false;
    if( m_f32CIRYY           != Value.m_f32CIRYY )           return false;
    if( m_f32CIRYZ           != Value.m_f32CIRYZ )           return false;
    if( m_f32CIRZZ           != Value.m_f32CIRZZ )           return false;
    if( m_UnitSurfaceNormal  != Value.m_UnitSurfaceNormal )  return false;
    if( m_f32COR             != Value.m_f32COR )             return false;
    return true;
}